

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

JavascriptMethod __thiscall
Js::ScriptFunction::UpdateThunkEntryPoint
          (ScriptFunction *this,FunctionEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  JavascriptMethod thunk;
  undefined4 *puVar5;
  FunctionBody *this_00;
  FunctionBody *functionBody;
  JavascriptMethod entryPoint_local;
  FunctionEntryPointInfo *entryPointInfo_local;
  ScriptFunction *this_local;
  
  ChangeEntryPoint(this,(ProxyEntryPointInfo *)entryPointInfo,entryPoint);
  thunk = RecyclableObject::GetEntryPoint((RecyclableObject *)this);
  bVar2 = CrossSite::IsThunk(thunk);
  this_local = (ScriptFunction *)entryPoint;
  if (bVar2) {
    iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])();
    if (iVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x13d,"(this->IsCrossSiteObject())","this->IsCrossSiteObject()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (entryPoint == ScriptContext::DebugProfileProbeThunk) {
      this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
      BVar4 = FunctionBody::IsInterpreterThunk(this_00);
      if ((BVar4 == 0) && (BVar4 = FunctionBody::IsNativeOriginalEntryPoint(this_00), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0x145,
                                    "(functionBody->IsInterpreterThunk() || functionBody->IsNativeOriginalEntryPoint())"
                                    ,
                                    "functionBody->IsInterpreterThunk() || functionBody->IsNativeOriginalEntryPoint()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_local = (ScriptFunction *)FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)this_00);
    }
  }
  return (JavascriptMethod)this_local;
}

Assistant:

JavascriptMethod ScriptFunction::UpdateThunkEntryPoint(FunctionEntryPointInfo* entryPointInfo, JavascriptMethod entryPoint)
    {
        this->ChangeEntryPoint(entryPointInfo, entryPoint);

        if (!CrossSite::IsThunk(this->GetEntryPoint()))
        {
            return entryPoint;
        }

        // We already pass through the cross site thunk, which would have called the profile thunk already if necessary
        // So just call the original entry point if our direct entry is the profile entry thunk
        // Otherwise, call the directEntryPoint which may have additional processing to do (e.g. ensure dynamic profile)
        Assert(this->IsCrossSiteObject());
        if (entryPoint != ProfileEntryThunk)
        {
            return entryPoint;
        }
        // Based on the comment below, this shouldn't be a defer deserialization function as it would have a deferred thunk
        FunctionBody * functionBody = this->GetFunctionBody();
        // The original entry point should be an interpreter thunk or the native entry point;
        Assert(functionBody->IsInterpreterThunk() || functionBody->IsNativeOriginalEntryPoint());
        return functionBody->GetOriginalEntryPoint();
    }